

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O0

int LSRKStepSetSTSMethodByName(void *arkode_mem,char *emethod)

{
  int iVar1;
  char *in_RSI;
  
  iVar1 = strcmp(in_RSI,"ARKODE_LSRK_RKC_2");
  if (iVar1 == 0) {
    iVar1 = LSRKStepSetSTSMethod(arkode_mem,emethod._4_4_);
    return iVar1;
  }
  iVar1 = strcmp(in_RSI,"ARKODE_LSRK_RKL_2");
  if (iVar1 != 0) {
    iVar1 = strcmp(in_RSI,"ARKODE_LSRK_SSP_S_2");
    if (((iVar1 == 0) || (iVar1 = strcmp(in_RSI,"ARKODE_LSRK_SSP_S_3"), iVar1 == 0)) ||
       (iVar1 = strcmp(in_RSI,"ARKODE_LSRK_SSP_10_4"), iVar1 == 0)) {
      arkProcessError((ARKodeMem)0x0,-0x16,0x9d,"LSRKStepSetSTSMethodByName",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                      ,
                      "Invalid method option: Call LSRKStepCreateSTS to create an STS method first."
                     );
    }
    arkProcessError((ARKodeMem)0x0,-0x16,0xa1,"LSRKStepSetSTSMethodByName",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                    ,"Unknown method type");
    return -0x16;
  }
  iVar1 = LSRKStepSetSTSMethod(arkode_mem,emethod._4_4_);
  return iVar1;
}

Assistant:

int LSRKStepSetSTSMethodByName(void* arkode_mem, const char* emethod)
{
  if (strcmp(emethod, "ARKODE_LSRK_RKC_2") == 0)
  {
    return LSRKStepSetSTSMethod(arkode_mem, ARKODE_LSRK_RKC_2);
  }
  if (strcmp(emethod, "ARKODE_LSRK_RKL_2") == 0)
  {
    return LSRKStepSetSTSMethod(arkode_mem, ARKODE_LSRK_RKL_2);
  }
  if ((strcmp(emethod, "ARKODE_LSRK_SSP_S_2") == 0) ||
      (strcmp(emethod, "ARKODE_LSRK_SSP_S_3") == 0) ||
      (strcmp(emethod, "ARKODE_LSRK_SSP_10_4") == 0))
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
  }

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown method type");

  return ARK_ILL_INPUT;
}